

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

err_t MetaGet(node *p,dataid Id,void *Data,size_t Size)

{
  undefined8 *puVar1;
  err_t eVar2;
  dataflags Type_00;
  size_t __n;
  size_t DataSize;
  uint32_t Bit;
  datatype Type;
  void *Ptr;
  nodemeta *m;
  intptr_t Upper;
  intptr_t Lower;
  intptr_t Mid;
  nodemetalookup *Lookup;
  nodemetalookuphead *Head;
  nodeclass *Class;
  size_t Size_local;
  void *Data_local;
  dataid Id_local;
  node *p_local;
  
  puVar1 = *(undefined8 **)((long)p->VMT + -0x28);
  if (puVar1 != (undefined8 *)0x0) {
    Upper = 0;
    m = (nodemeta *)*puVar1;
    while (Upper <= (long)m) {
      Lower = (long)(&m->field_0x0 + Upper) >> 1;
      if (Id < (ulong)puVar1[Lower * 2 + 1]) {
        m = (nodemeta *)(Lower + -1);
      }
      else {
        if (Id <= (ulong)puVar1[Lower * 2 + 1]) {
          Ptr = (void *)puVar1[Lower * 2 + 2];
          if ((*Ptr & 0xff) == 0x28) {
            eVar2 = (**(code **)((long)Ptr + 8))(p,Id,Data,Size);
            return eVar2;
          }
          if ((*Ptr & 0xff) == 0x26) {
            Lower = Lower + -1;
            Ptr = (void *)puVar1[Lower * 2 + 2];
          }
          if ((*Ptr & 0xc0) != 0x40) {
            __assert_fail("(m->Meta & META_MODE_MASK)==META_MODE_DATA",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                          ,0x818,"err_t MetaGet(node *, dataid, void *, size_t)");
          }
          Type_00 = (dataflags)(int)(*Ptr & 0x3f);
          if (*(long *)((long)Ptr + 8) < 0) {
            Type = (datatype)Node_GetData(p,Id,Type_00);
            if ((void *)Type == (void *)0x0) {
              if (((*(uint *)((long)Ptr + 0x10) & 0xff) == 2) &&
                 ((*(ulong *)((long)Ptr + 0x18) & 0x10) != 0)) {
                return -3;
              }
              memset(Data,0,Size);
              return 0;
            }
          }
          else {
            Type = (long)&p->FourCC + *(long *)((long)Ptr + 8);
          }
          if (Type_00 == 4) {
            tcscpy_s((tchar_t *)Data,Size,(tchar_t *)Type);
          }
          else if (Type_00 == 0x18) {
            if ((puVar1[(Lower + 1) * 2 + 1] != Id) ||
               ((*(uint *)puVar1[(Lower + 1) * 2 + 2] & 0xff) != 0x26)) {
              __assert_fail("Lookup[Mid+1].Id == Id && Lookup[Mid+1].Meta->Meta==META_PARAM_BIT",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                            ,0x834,"err_t MetaGet(node *, dataid, void *, size_t)");
            }
            if (Size != 8) {
              return -3;
            }
            *(long *)Data =
                 (long)(int)(uint)((*(uint *)Type &
                                   (uint)*(undefined8 *)(puVar1[(Lower + 1) * 2 + 2] + 8)) != 0);
          }
          else {
            __n = Node_MaxDataSize(p,(ulong)(*Ptr >> 8),Type_00,0x28);
            if (Size != __n) {
              __assert_fail("Size == DataSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                            ,0x83d,"err_t MetaGet(node *, dataid, void *, size_t)");
            }
            if (__n != Size) {
              return -3;
            }
            if (__n == 4) {
              *(undefined4 *)Data = *(undefined4 *)Type;
            }
            else {
              memcpy(Data,(void *)Type,__n);
            }
          }
          return 0;
        }
        Upper = Lower + 1;
      }
    }
  }
  return -4;
}

Assistant:

static err_t MetaGet(node* p,dataid Id,void* Data,size_t Size)
{
    const nodeclass* Class = NodeGetClass(p);
    nodemetalookuphead* Head = Class->MetaGet;
    if (Head)
    {
        nodemetalookup* Lookup = (nodemetalookup*)(Head+1);
        intptr_t Mid;
        intptr_t Lower = 0;
        intptr_t Upper = Head->Upper;

        while (Upper >= Lower)
        {
            Mid = (Upper + Lower) >> 1;

            if (Lookup[Mid].Id>Id)
                Upper = Mid-1;
            else if (Lookup[Mid].Id<Id)
                Lower = Mid+1;
            else
            {
                const nodemeta* m = Lookup[Mid].Meta;
                const void* Ptr;
                datatype Type;

                if (m->Meta == META_PARAM_GET)
                    return ((err_t(*)(node*,dataid,void*,size_t))m->Data)(p,Id,Data,Size);

                if (m->Meta == META_PARAM_BIT)
                    m = Lookup[--Mid].Meta;

                assert((m->Meta & META_MODE_MASK)==META_MODE_DATA);

                Type = (m->Meta & TYPE_MASK);
                if ((intptr_t)m->Data<0)
                {
                    Ptr = Node_GetData(p,Id,Type);
                    if (!Ptr)
                    {
#if defined(CONFIG_CORECDOC)
                        if (m[2].Meta == META_PARAM_DATA_FLAGS && (m[2].Data & DFLAG_NODEFAULT))
#else
                        if (m[1].Meta == META_PARAM_DATA_FLAGS && (m[1].Data & DFLAG_NODEFAULT))
#endif
                            return ERR_INVALID_DATA;

                        memset(Data,0,Size);
                        return ERR_NONE;
                    }
                }
                else
                    Ptr = (const uint8_t*)p + (intptr_t)m->Data;

                if (Type == TYPE_STRING)
                    tcscpy_s(Data,Size/sizeof(tchar_t),(const tchar_t*)Ptr);
                else
                if (Type == TYPE_BOOL_BIT)
                {
                    uint32_t Bit;
                    assert(Lookup[Mid+1].Id == Id && Lookup[Mid+1].Meta->Meta==META_PARAM_BIT);
                    Bit = (uint32_t)Lookup[Mid+1].Meta->Data;
                    if (Size != sizeof(bool_t))
                        return ERR_INVALID_DATA;
                    *(bool_t*)Data = (*(const uint32_t*)Ptr & Bit) != 0;
                }
                else
                {
                    size_t DataSize = Node_MaxDataSize(p,m->Id,Type,META_PARAM_GET);
                    assert(Size == DataSize);
                    if (DataSize != Size)
                        return ERR_INVALID_DATA;

                    if (DataSize==sizeof(int))
                        *(int*)Data = *(const int*)Ptr;
                    else
                        memcpy(Data,Ptr,DataSize);
                }

                return ERR_NONE;
            }
        }
    }
    return ERR_INVALID_PARAM;
}